

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

void __thiscall QDateTimeEdit::setMaximumDate(QDateTimeEdit *this,QDate max)

{
  QDate date;
  long in_FS_OFFSET;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (max.jd + 0xb69eeff91fU < 0x16d3e147974) {
    date.jd = *(qint64 *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
    ::QVariant::toTime();
    QDateTimeEditPrivate::dateTimeValue
              ((QDateTimeEditPrivate *)&stack0xffffffffffffffd0,date,(QTime)(int)max.jd);
    setMaximumDateTime(this,(QDateTime *)&stack0xffffffffffffffd0);
    QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffd0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::setMaximumDate(QDate max)
{
    Q_D(QDateTimeEdit);
    if (max.isValid())
        setMaximumDateTime(d->dateTimeValue(max, d->maximum.toTime()));
}